

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(MinimalityCheck *this,FwdCheck *afwd)

{
  FwdCheck *afwd_local;
  MinimalityCheck *this_local;
  
  this->fwd = *afwd;
  this->high = 0xffffffff;
  this->low = 0;
  this->next = 0;
  this->scc = 0;
  if (100 < (*(uint *)&this->fwd >> 0x18 & 0x7f)) {
    *(uint *)&this->fwd = *(uint *)&this->fwd & 0x80ffffff | 0x64000000;
  }
  if (((ulong)this->fwd & 0xffffff) == 0) {
    *(uint *)&this->fwd =
         *(uint *)&this->fwd & 0xff000000 | (*(uint *)&this->fwd & 0xffffff ^ 0xffffffff) & 0xffffff
    ;
  }
  this->high = *(uint *)&this->fwd & 0xffffff;
  return;
}

Assistant:

DefaultUnfoundedCheck::MinimalityCheck::MinimalityCheck(const FwdCheck& afwd) : fwd(afwd), high(UINT32_MAX), low(0), next(0), scc(0) {
	if (fwd.highPct > 100) { fwd.highPct  = 100; }
	if (fwd.highStep == 0) { fwd.highStep = ~fwd.highStep; }
	high = fwd.highStep;
}